

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O1

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = count >> 6;
  bVar1 = (byte)count & 0x3f;
  if ((uVar2 <= limbs) && ((count & 0x3f) == 0 || limbs != uVar2)) {
    if (0x3f < count) {
      if (limbs == uVar2) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        do {
          X[uVar3] = X[uVar2 + uVar3];
          uVar3 = uVar3 + 1;
        } while (limbs - uVar2 != uVar3);
      }
      if (uVar3 <= limbs && limbs - uVar3 != 0) {
        memset(X + uVar3,0,(limbs - uVar3) * 8);
      }
    }
    if (((count & 0x3f) != 0) && (limbs != 0)) {
      uVar2 = 0;
      do {
        uVar3 = X[limbs - 1];
        X[limbs - 1] = uVar3 >> bVar1 | uVar2;
        limbs = limbs - 1;
        uVar2 = uVar3 << (0x40 - bVar1 & 0x3f);
      } while (limbs != 0);
    }
    return;
  }
  memset(X,0,limbs << 3);
  return;
}

Assistant:

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if (v0 > limbs || (v0 == limbs && v1 > 0)) {
        memset(X, 0, limbs * ciL);
        return;
    }

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = 0; i < limbs - v0; i++) {
            X[i] = X[i + v0];
        }

        for (; i < limbs; i++) {
            X[i] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = limbs; i > 0; i--) {
            r1 = X[i - 1] << (biL - v1);
            X[i - 1] >>= v1;
            X[i - 1] |= r0;
            r0 = r1;
        }
    }
}